

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Gla2Vta(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  uint local_34;
  int nFrames;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  local_34 = pAbc->nFrames;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"Fvh");
      if (iVar2 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Gla2Vta(): There is no AIG.\n");
          return 0;
        }
        if (pAbc->pGia->vGateClasses == (Vec_Int_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Gla2Vta(): There is no gate-level abstraction is defined.\n")
          ;
          return 0;
        }
        if (pAbc->nFrames < 1) {
          Abc_Print(-1,
                    "Abc_CommandAbc9Gla2Vta(): The number of timeframes (%d) should be a positive integer.\n"
                    ,(ulong)local_34);
          return 0;
        }
        Vec_IntFreeP(&pAbc->pGia->vObjClasses);
        pVVar3 = Gia_VtaConvertFromGla(pAbc->pGia,pAbc->pGia->vGateClasses,local_34);
        pAbc->pGia->vObjClasses = pVVar3;
        Vec_IntFreeP(&pAbc->pGia->vGateClasses);
        return 0;
      }
      if (iVar2 == 0x46) break;
      if ((iVar2 == 0x68) || (iVar2 != 0x76)) goto LAB_002c6b1e;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (argc <= globalUtilOptind) break;
    local_34 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_34 < 0) {
LAB_002c6b1e:
      Abc_Print(-2,"usage: &gla_vta [-F num] [-vh]\n");
      Abc_Print(-2,"\t          maps fixed- into variable-time-frame gate-level abstraction\n");
      Abc_Print(-2,
                "\t-F num  : timeframes in the resulting variable-time-frame abstraction [default = %d]\n"
                ,(ulong)local_34);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_002c6b1e;
}

Assistant:

int Abc_CommandAbc9Gla2Vta( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    int nFrames = pAbc->nFrames;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): There is no AIG.\n" );
        return 0;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): There is no gate-level abstraction is defined.\n" );
        return 0;
    }
    if ( pAbc->nFrames < 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Gla2Vta(): The number of timeframes (%d) should be a positive integer.\n", nFrames );
        return 0;
    }
    Vec_IntFreeP( &pAbc->pGia->vObjClasses );
    pAbc->pGia->vObjClasses = Gia_VtaConvertFromGla( pAbc->pGia, pAbc->pGia->vGateClasses, nFrames );
    Vec_IntFreeP( &pAbc->pGia->vGateClasses );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_vta [-F num] [-vh]\n" );
    Abc_Print( -2, "\t          maps fixed- into variable-time-frame gate-level abstraction\n" );
    Abc_Print( -2, "\t-F num  : timeframes in the resulting variable-time-frame abstraction [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}